

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckExpectation
          (ScriptValidator *this,Location *loc,TypeVector *result_types,ConstVector *expected,
          char *desc)

{
  ulong uVar1;
  TypeVector actual_types;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_58;
  Location *local_40;
  Type local_38;
  
  local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (expected != (ConstVector *)desc) {
    local_40 = loc;
    do {
      local_38 = *(Type *)((long)expected + 0x20);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::emplace_back<wabt::Type>
                (&local_58,&local_38);
      expected = (ConstVector *)((long)expected + 0x50);
      loc = local_40;
    } while (expected != (ConstVector *)desc);
  }
  if ((long)local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 ==
      (long)(result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    if (local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar1 = 0;
      do {
        CheckTypeIndex(this,loc,local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar1],
                       (result_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar1],"action",(Index)uVar1,
                       "result");
        uVar1 = uVar1 + 1;
      } while (uVar1 < (ulong)((long)local_58.
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_58.
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  else {
    PrintError(this,loc,"expected %zd results, got %zd");
  }
  if (local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ScriptValidator::CheckExpectation(const Location* loc,
                                       const TypeVector& result_types,
                                       const ConstVector& expected,
                                       const char* desc) {
  // Here we take the concrete expected output types verify those actains
  // the types that are the result of the action.
  TypeVector actual_types;
  for (auto ex : expected) {
    actual_types.push_back(ex.type());
  }
  CheckResultTypes(loc, actual_types, result_types, desc);
}